

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::DoLeftParen(ParseState *this,StringPiece *name)

{
  int iVar1;
  bool bVar2;
  void *pvVar3;
  const_pointer pcVar4;
  void *pvVar5;
  StringPiece *in_RSI;
  Regexp *in_RDI;
  ParseState *unaff_retaddr;
  Regexp *re;
  ParseFlags in_stack_ffffffffffffffb8;
  RegexpOp in_stack_ffffffffffffffbc;
  Regexp *in_stack_ffffffffffffffc0;
  Regexp *re_00;
  
  re_00 = in_RDI;
  pvVar3 = operator_new(0x28);
  Regexp(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  iVar1 = *(int *)(in_RDI + 1);
  *(int *)(in_RDI + 1) = iVar1 + 1;
  *(int *)((long)pvVar3 + 0x18) = iVar1 + 1;
  pcVar4 = StringPiece::data(in_RSI);
  if (pcVar4 != (const_pointer)0x0) {
    pvVar5 = operator_new(0x20);
    StringPiece::operator_cast_to_string((StringPiece *)re_00);
    *(void **)((long)pvVar3 + 0x20) = pvVar5;
  }
  bVar2 = PushRegexp(unaff_retaddr,re_00);
  return bVar2;
}

Assistant:

bool Regexp::ParseState::DoLeftParen(const StringPiece& name) {
  Regexp* re = new Regexp(kLeftParen, flags_);
  re->cap_ = ++ncap_;
  if (name.data() != NULL)
    re->name_ = new std::string(name);
  return PushRegexp(re);
}